

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::base_access<5>::plus_overflows<units::detail::unit_data>
               (unit_data *a,unit_data *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((int)*a << 0xd) >> 0x1d;
  iVar2 = ((int)*b << 0xd) >> 0x1d;
  if (0 < iVar2) {
    return 3 - iVar2 < iVar1;
  }
  if (-1 < iVar2) {
    return false;
  }
  return iVar1 < -4 - iVar2;
}

Assistant:

constexpr int kelvin() const { return kelvin_; }